

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O1

string * __thiscall
ghc::options::consumeOption_abi_cxx11_
          (string *__return_storage_ptr__,options *this,option_info *optinfo)

{
  type tVar1;
  ulong uVar2;
  char *pcVar3;
  runtime_error *this_00;
  size_t skip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tVar1 = optinfo->_type;
  if (tVar1 == arg_needed) {
    uVar2 = (this->_current)._M_string_length;
    if (1 < uVar2) {
      pcVar3 = (this->_current)._M_dataplus._M_p;
      if (((*pcVar3 == '-') && (uVar2 != 2)) && (pcVar3[1] != '-')) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->_current);
LAB_0013372b:
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        skip = 1;
        goto LAB_001337b2;
      }
    }
    if (((this->_next)._M_string_length == 0) || (*(this->_next)._M_dataplus._M_p == '-')) {
      if ((this->_missing_argument_hamdler).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->_missing_argument_hamdler)._M_invoker)
                  ((_Any_data *)&this->_missing_argument_hamdler,&optinfo->_name);
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_48,"Missing argument for option: ",&optinfo->_name);
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (tVar1 != arg_optional) {
      if (tVar1 != no_arg) {
        return __return_storage_ptr__;
      }
      uVar2 = (this->_current)._M_string_length;
      skip = 1;
      if (1 < uVar2) {
        pcVar3 = (this->_current)._M_dataplus._M_p;
        if (((*pcVar3 == '-') && (uVar2 != 2)) && (pcVar3[1] != '-')) {
          std::__cxx11::string::erase((ulong)&this->_current,1);
          return __return_storage_ptr__;
        }
      }
      goto LAB_001337b2;
    }
    uVar2 = (this->_current)._M_string_length;
    if (1 < uVar2) {
      pcVar3 = (this->_current)._M_dataplus._M_p;
      if (((*pcVar3 == '-') && (uVar2 != 2)) && (pcVar3[1] != '-')) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->_current);
        goto LAB_0013372b;
      }
    }
    skip = 1;
    if (((this->_next)._M_string_length == 0) || (*(this->_next)._M_dataplus._M_p == '-'))
    goto LAB_001337b2;
  }
  skip = 2;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_001337b2:
  nextArg(this,skip);
  return __return_storage_ptr__;
}

Assistant:

std::string consumeOption(const option_info& optinfo)
    {
        std::string arg;
        switch (optinfo._type) {
            case option_info::type::no_arg:
                if (is_short_option(_current) && _current.length()>2) {
                    _current.erase(1,1);
                }
                else {
                    nextArg();
                }
                break;
            case option_info::type::arg_optional:
                if (is_short_option(_current) && _current.length() > 2) {
                        arg = _current.substr(2);
                        nextArg();
                }
                else if (!_next.empty() && _next[0] != '-') {
                    arg = _next;
                    nextArg(2);
                }
                else {
                    nextArg();
                }
                break;
            case option_info::type::arg_needed:
                if (is_short_option(_current) && _current.length() > 2) {
                    arg = _current.substr(2);
                    nextArg();
                }
                else if (!_next.empty() && _next[0] != '-') {
                    arg = _next;
                    nextArg(2);
                }
                else {
                    if (_missing_argument_hamdler) {
                        _missing_argument_hamdler(optinfo._name);
                    }
                    else {
                        throw std::runtime_error("Missing argument for option: " + optinfo._name);
                    }
                }
                break;
        }
        return arg;
    }